

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.cpp
# Opt level: O1

char * nivalis::OpCode::repr(uint32_t opcode)

{
  if ((int)opcode < 0x50) {
    if ((int)opcode < 0x20) {
      switch(opcode) {
      case 0:
        return "nan";
      case 1:
        return "\v";
      case 2:
        return "\r";
      case 3:
        return "$";
      case 8:
        return "@@";
      case 0xc:
        return "\t(@)";
      case 0x10:
        return "{@: @, @}";
      case 0x11:
        return "sum(\r, @, @)[@]";
      case 0x12:
        return "prod(\r, @, @)[@]";
      case 0x18:
        return "{0: @, @}";
      }
    }
    else if ((int)opcode < 0x31) {
      if (opcode == 0x20) {
        return "(@ + @)";
      }
      if (opcode == 0x21) {
        return "(@ - @)";
      }
      if (opcode == 0x30) {
        return "(@ * @)";
      }
    }
    else if ((int)opcode < 0x40) {
      if (opcode == 0x31) {
        return "(@ / @)";
      }
      if (opcode == 0x32) {
        return "(@ % @)";
      }
    }
    else {
      if (opcode == 0x40) {
        return "(@ ^ @)";
      }
      if (opcode == 0x41) {
        return "log(@, @)";
      }
    }
  }
  else {
    switch(opcode) {
    case 0x8000:
      return "(-@)";
    case 0x8001:
      return "not(@)";
    case 0x8002:
      return "abs(@)";
    case 0x8003:
      return "sqrt(@)";
    case 0x8004:
      return "@^2";
    case 0x8005:
      return "sgn(@)";
    case 0x8006:
      return "floor(@)";
    case 0x8007:
      return "ceil(@)";
    case 0x8008:
      return "round(@)";
    case 0x8009:
      return "exp(@)";
    case 0x800a:
      return "exp2(@)";
    case 0x800b:
      return "ln(@)";
    case 0x800c:
      return "log10(@)";
    case 0x800d:
      return "log2(@)";
    case 0x800e:
      return "fact(@)";
    case 0x800f:
      return "sin(@)";
    case 0x8010:
      return "cos(@)";
    case 0x8011:
      return "tan(@)";
    case 0x8012:
      return "arcsin(@)";
    case 0x8013:
      return "arccos(@)";
    case 0x8014:
      return "arctan(@)";
    case 0x8015:
      return "sinh(@)";
    case 0x8016:
      return "cosh(@)";
    case 0x8017:
      return "tanh(@)";
    case 0x8018:
      return "gamma(@)";
    case 0x8019:
      return "lgamma(@)";
    case 0x801a:
      return "digamma(@)";
    case 0x801b:
      return "trigamma(@)";
    case 0x801c:
      return "erf(@)";
    case 0x801d:
      return "zeta(@)";
    case 0x801e:
      return "sigmoid(@)";
    case 0x801f:
      return "softplus(@)";
    case 0x8020:
      return "gausspdf(@)";
    }
    switch(opcode) {
    case 0x50:
      return "max(@, @)";
    case 0x51:
      return "min(@, @)";
    case 0x52:
      return "(@ & @)";
    case 0x53:
      return "(@ | @)";
    case 0x54:
      return "xor(@, @)";
    case 0x55:
    case 0x56:
    case 0x57:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
      break;
    case 0x60:
      return "(@ < @)";
    case 0x61:
      return "(@ <= @)";
    case 0x62:
      return "(@ == @)";
    case 99:
      return "(@ != @)";
    case 100:
      return "(@ >= @)";
    case 0x65:
      return "(@ > @)";
    default:
      switch(opcode) {
      case 0x4000:
        return "gcd(@, @)";
      case 0x4001:
        return "lcm(@, @)";
      case 0x4002:
        return "choose(@, @)";
      case 0x4003:
        return "fafact(@, @)";
      case 0x4004:
        return "rifact(@, @)";
      case 0x4005:
        return "beta(@, @)";
      case 0x4006:
        return "polygamma(@, @)";
      }
    }
  }
  return "";
}

Assistant:

const char* repr(uint32_t opcode) {
    using namespace OpCode;
    switch (opcode) {
        case OpCode::null:  return "nan";
        case val:   return "\v";
        case ref:   return "\r";
        case sums:     return "sum(\r, @, @)[@]";
        case prods:    return "prod(\r, @, @)[@]";
        case bnz:   return "{@: @, @}";
        case bsel:  return "{0: @, @}";
        case add:   return "(@ + @)";
        case sub:   return "(@ - @)";
        case mul:   return "(@ * @)";
        case divi:   return "(@ / @)";
        case mod:   return "(@ % @)";
        case power: return "(@ ^ @)";
        case logbase:  return "log(@, @)";
        case max:   return "max(@, @)";
        case min:   return "min(@, @)";
        case land:  return "(@ & @)";
        case lor:   return "(@ | @)";
        case lxor:  return "xor(@, @)";
        case lt:    return "(@ < @)";
        case le:    return "(@ <= @)";
        case eq:    return "(@ == @)";
        case ne:    return "(@ != @)";
        case ge:    return "(@ >= @)";
        case gt:    return "(@ > @)";
        case gcd:   return "gcd(@, @)";
        case lcm:   return "lcm(@, @)";
        case choose:    return "choose(@, @)";
        case fafact:    return "fafact(@, @)";
        case rifact:    return "rifact(@, @)";
        case betab:      return "beta(@, @)";
        case polygammab: return "polygamma(@, @)";
        case unaryminus:   return "(-@)";
        case lnot:     return "not(@)";
        case absb:      return "abs(@)";
        case sqrtb:     return "sqrt(@)";
        case sqrb:      return "@^2";
        case sgn:      return "sgn(@)";
        case floorb:    return "floor(@)";
        case ceilb:     return "ceil(@)";
        case roundb:    return "round(@)";
        case expb:      return "exp(@)";
        case exp2b:     return "exp2(@)";
        case logb:      return "ln(@)";
        case log10b:    return "log10(@)";
        case log2b:     return "log2(@)";
        case factb:     return "fact(@)";
        case sinb:      return "sin(@)";
        case cosb:      return "cos(@)";
        case tanb:      return "tan(@)";
        case asinb:     return "arcsin(@)";
        case acosb:     return "arccos(@)";
        case atanb:     return "arctan(@)";
        case sinhb:     return "sinh(@)";
        case coshb:     return "cosh(@)";
        case tanhb:     return "tanh(@)";
        case tgammab:    return "gamma(@)";
        case lgammab:   return "lgamma(@)";
        case digammab:  return "digamma(@)";
        case trigammab: return "trigamma(@)";
        case erfb:      return "erf(@)";
        case zetab:     return "zeta(@)";
        case sigmoidb:     return "sigmoid(@)";
        case softplusb:     return "softplus(@)";
        case gausspdfb:     return "gausspdf(@)";
        case thunk_jmp: return "";
        case thunk_ret: return "@@";
        case arg: return "$";
        case call: return "\t(@)";
        default: return "";
    };
}